

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

float __thiscall LLVMBC::APFloat::convertToFloat(APFloat *this)

{
  TypeID TVar1;
  LoggingCallback p_Var2;
  void *pvVar3;
  char local_1038 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  double f_1;
  uint32_t u;
  float f;
  APFloat *this_local;
  
  TVar1 = Type::getTypeID(this->type);
  if (TVar1 == FloatTyID) {
    this_local._4_4_ = (float)this->value;
  }
  else if (TVar1 == DoubleTyID) {
    this_local._4_4_ = (float)(double)this->value;
  }
  else {
    p_Var2 = dxil_spv::get_thread_log_callback();
    if (p_Var2 == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown FP type in APFloat::convertToFloat().\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1038,0x1000,"Unknown FP type in APFloat::convertToFloat().\n");
      pvVar3 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var2)(pvVar3,Error,local_1038);
    }
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float APFloat::convertToFloat() const
{
	switch (type->getTypeID())
	{
	case Type::TypeID::FloatTyID:
	{
		float f;
		auto u = uint32_t(value);
		static_assert(sizeof(f) == sizeof(u), "Float is not 32-bit.");
		memcpy(&f, &u, sizeof(float));
		return f;
	}
	case Type::TypeID::DoubleTyID:
	{
		double f;
		static_assert(sizeof(f) == sizeof(value), "Double is not 64-bit.");
		memcpy(&f, &value, sizeof(double));
		return float(f);
	}

	default:
		LOGE("Unknown FP type in APFloat::convertToFloat().\n");
		return 0.0f;
	}
}